

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

UChar * __thiscall
icu_63::Normalizer2Impl::getRawDecomposition
          (Normalizer2Impl *this,UChar32 c,UChar *buffer,int32_t *length)

{
  ushort uVar1;
  UChar UVar2;
  undefined2 uVar3;
  uint16_t *puVar4;
  long lVar5;
  uint16_t uVar6;
  UChar *pUVar7;
  ulong uVar8;
  uint uVar9;
  
  if ((int)(uint)(ushort)this->minDecompNoCP <= c) {
    uVar6 = getNorm16(this,c);
    pUVar7 = (UChar *)0x0;
    if ((this->minYesNo <= uVar6) && (uVar6 < this->minMaybeYes)) {
      pUVar7 = buffer;
      if ((this->minYesNo == uVar6) || (uVar3 = this->minYesNoMappingsOnly, (uVar3 | 1) == uVar6)) {
        Hangul::getRawDecomposition(c,buffer);
        *length = 2;
      }
      else if (uVar6 < this->limitNoNo) {
        puVar4 = this->extraData;
        uVar8 = (ulong)(uVar6 & 0xfffe);
        uVar1 = *(ushort *)((long)puVar4 + uVar8);
        uVar9 = uVar1 & 0x1f;
        if ((uVar1 & 0x40) == 0) {
          *length = uVar9;
          pUVar7 = (UChar *)((long)puVar4 + uVar8 + 2);
        }
        else {
          lVar5 = uVar8 - (uVar1 >> 6 & 2);
          UVar2 = *(UChar *)((long)puVar4 + lVar5 + -2);
          if ((ushort)UVar2 < 0x20) {
            *length = (uint)(ushort)UVar2;
            pUVar7 = (UChar *)((long)puVar4 + ((lVar5 + -2) - (ulong)((uint)(ushort)UVar2 * 2)));
          }
          else {
            *buffer = UVar2;
            u_memcpy_63(buffer + 1,(UChar *)((long)puVar4 + uVar8 + 6),uVar9 - 2);
            *length = uVar9 - 1;
          }
        }
      }
      else {
        uVar9 = ((uint)(uVar6 >> 3) + c) - (uint)this->centerNoNoDelta;
        if (uVar9 < 0x10000) {
          *length = 1;
          *buffer = (UChar)uVar9;
        }
        else {
          *buffer = (short)(uVar9 >> 10) + L'ퟀ';
          *length = 2;
          buffer[1] = (UChar)uVar9 & 0x3ffU | 0xdc00;
        }
      }
    }
    return pUVar7;
  }
  return (UChar *)0x0;
}

Assistant:

const UChar *
Normalizer2Impl::getRawDecomposition(UChar32 c, UChar buffer[30], int32_t &length) const {
    uint16_t norm16;
    if(c<minDecompNoCP || isDecompYes(norm16=getNorm16(c))) {
        // c does not decompose
        return NULL;
    } else if(isHangulLV(norm16) || isHangulLVT(norm16)) {
        // Hangul syllable: decompose algorithmically
        Hangul::getRawDecomposition(c, buffer);
        length=2;
        return buffer;
    } else if(isDecompNoAlgorithmic(norm16)) {
        c=mapAlgorithmic(c, norm16);
        length=0;
        U16_APPEND_UNSAFE(buffer, length, c);
        return buffer;
    }
    // c decomposes, get everything from the variable-length extra data
    const uint16_t *mapping=getMapping(norm16);
    uint16_t firstUnit=*mapping;
    int32_t mLength=firstUnit&MAPPING_LENGTH_MASK;  // length of normal mapping
    if(firstUnit&MAPPING_HAS_RAW_MAPPING) {
        // Read the raw mapping from before the firstUnit and before the optional ccc/lccc word.
        // Bit 7=MAPPING_HAS_CCC_LCCC_WORD
        const uint16_t *rawMapping=mapping-((firstUnit>>7)&1)-1;
        uint16_t rm0=*rawMapping;
        if(rm0<=MAPPING_LENGTH_MASK) {
            length=rm0;
            return (const UChar *)rawMapping-rm0;
        } else {
            // Copy the normal mapping and replace its first two code units with rm0.
            buffer[0]=(UChar)rm0;
            u_memcpy(buffer+1, (const UChar *)mapping+1+2, mLength-2);
            length=mLength-1;
            return buffer;
        }
    } else {
        length=mLength;
        return (const UChar *)mapping+1;
    }
}